

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::XYZVisitor::internalVisit(XYZVisitor *this,StuntDouble *sd)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *peVar3;
  double *pdVar4;
  long in_RDI;
  string line;
  char buffer [1024];
  iterator i;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::AtomData> *in_stack_fffffffffffff9e8;
  AtomData *in_stack_fffffffffffff9f0;
  StuntDouble *in_stack_fffffffffffff9f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa00;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffa08;
  double dVar5;
  iterator *in_stack_fffffffffffffa10;
  AtomData *in_stack_fffffffffffffa18;
  allocator<char> *in_stack_fffffffffffffa20;
  char *in_stack_fffffffffffffa28;
  double dVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  string local_4d8 [52];
  undefined4 local_4a4;
  allocator<char> local_479;
  string local_478 [48];
  AtomData local_448 [16];
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  local_48;
  __shared_ptr local_40 [64];
  
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34ca04);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34ca11);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34ca1e);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  ::__normal_iterator(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  StuntDouble::getPropertyByName(in_stack_fffffffffffff9f8,(string *)in_stack_fffffffffffff9f0);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff9f0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff9e8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34caaf);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff9f0,
                          in_stack_fffffffffffff9e8);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(in_stack_fffffffffffffa08);
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34cb1a);
    bVar1 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff9f0,
                            in_stack_fffffffffffff9e8);
    if (bVar1) {
      local_4a4 = 1;
    }
    else {
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x34cba9);
      AtomData::beginAtomInfo(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      std::shared_ptr<OpenMD::AtomInfo>::operator=
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff9f0,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff9e8);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34cbe5);
      while( true ) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
        if (!bVar1) break;
        std::__cxx11::string::string(local_4d8);
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34cc1d);
        uVar2 = std::__cxx11::string::c_str();
        snprintf((char *)local_448,0x400,"%s",uVar2);
        std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
        if ((*(byte *)(in_RDI + 0x660) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34cc94);
          pdVar4 = Vector<double,_3U>::operator[](&(peVar3->pos).super_Vector<double,_3U>,0);
          dVar5 = *pdVar4;
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34ccce);
          pdVar4 = Vector<double,_3U>::operator[](&(peVar3->pos).super_Vector<double,_3U>,1);
          dVar6 = *pdVar4;
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34cd0b);
          pdVar4 = Vector<double,_3U>::operator[](&(peVar3->pos).super_Vector<double,_3U>,2);
          snprintf((char *)local_448,0x400,"%15.8f%15.8f%15.8f",dVar5,dVar6,*pdVar4);
          std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
        }
        if ((*(byte *)(in_RDI + 0x664) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34cdd5);
          if ((peVar3->hasCharge & 1U) != 0) {
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34cdeb);
            snprintf((char *)local_448,0x400,"%15.8f",peVar3->charge);
            std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
          }
        }
        if ((*(byte *)(in_RDI + 0x663) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34ce51);
          if ((peVar3->hasVector & 1U) != 0) {
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34ce7b);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->vec).super_Vector<double,_3U>,0);
            dVar5 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34ceb5);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->vec).super_Vector<double,_3U>,1);
            dVar6 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34cef2);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->vec).super_Vector<double,_3U>,2);
            snprintf((char *)local_448,0x400,"%15.8f%15.8f%15.8f",dVar5,dVar6,*pdVar4);
            std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
          }
        }
        if ((*(byte *)(in_RDI + 0x661) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34cf81);
          if ((peVar3->hasVelocity & 1U) != 0) {
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34cfab);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->vel).super_Vector<double,_3U>,0);
            dVar5 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34cfe5);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->vel).super_Vector<double,_3U>,1);
            dVar6 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d01f);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->vel).super_Vector<double,_3U>,2);
            snprintf((char *)local_448,0x400,"%15.8f%15.8f%15.8f",dVar5,dVar6,*pdVar4);
            std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
          }
        }
        if ((*(byte *)(in_RDI + 0x662) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34d0a5);
          if ((peVar3->hasForce & 1U) != 0) {
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d0cc);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->frc).super_Vector<double,_3U>,0);
            dVar5 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d0fd);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->frc).super_Vector<double,_3U>,1);
            dVar6 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d131);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->frc).super_Vector<double,_3U>,2);
            snprintf((char *)local_448,0x400,"%15.8f%15.8f%15.8f",dVar5,dVar6,*pdVar4);
            std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
          }
        }
        if ((*(byte *)(in_RDI + 0x665) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34d1b1);
          if ((peVar3->hasElectricField & 1U) != 0) {
            in_stack_fffffffffffffa18 = local_448;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d1d8);
            pdVar4 = Vector<double,_3U>::operator[](&(peVar3->eField).super_Vector<double,_3U>,0);
            dVar5 = *pdVar4;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d20c);
            in_stack_fffffffffffffa10 =
                 (iterator *)
                 Vector<double,_3U>::operator[](&(peVar3->eField).super_Vector<double,_3U>,1);
            in_stack_fffffffffffff9f8 = (StuntDouble *)in_stack_fffffffffffffa10->_M_current;
            peVar3 = std::
                     __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x34d243);
            in_stack_fffffffffffffa00 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)Vector<double,_3U>::operator[](&(peVar3->eField).super_Vector<double,_3U>,2);
            snprintf((char *)in_stack_fffffffffffffa18,0x400,"%15.8f%15.8f%15.8f",dVar5,
                     in_stack_fffffffffffff9f8,
                     (in_stack_fffffffffffffa00->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::operator+=(local_4d8,(char *)local_448);
          }
        }
        if ((*(byte *)(in_RDI + 0x666) & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34d2c2);
          in_stack_fffffffffffff9f0 = local_448;
          snprintf((char *)in_stack_fffffffffffff9f0,0x400,"%10d",(ulong)(uint)peVar3->globalID);
          std::__cxx11::string::operator+=(local_4d8,(char *)in_stack_fffffffffffff9f0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffa00,(value_type *)in_stack_fffffffffffff9f8);
        std::__cxx11::string::~string(local_4d8);
        std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34d333);
        AtomData::nextAtomInfo(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
        std::shared_ptr<OpenMD::AtomInfo>::operator=
                  ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff9f0,
                   (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff9e8);
        std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34d36f);
      }
      local_4a4 = 0;
    }
  }
  else {
    local_4a4 = 1;
  }
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34d38c);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34d399);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34d3a6);
  return;
}

Assistant:

void XYZVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    char buffer[1024];

    // if there is not atom data, just skip it
    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      std::string line;
      snprintf(buffer, 1024, "%s", atomInfo->atomTypeName.c_str());
      line += buffer;

      if (doPositions_) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->pos[0],
                 atomInfo->pos[1], atomInfo->pos[2]);
        line += buffer;
      }
      if (doCharges_ && atomInfo->hasCharge) {
        snprintf(buffer, 1024, "%15.8f", atomInfo->charge);
        line += buffer;
      }
      if (doVectors_ && atomInfo->hasVector) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vec[0],
                 atomInfo->vec[1], atomInfo->vec[2]);
        line += buffer;
      }
      if (doVelocities_ && atomInfo->hasVelocity) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vel[0],
                 atomInfo->vel[1], atomInfo->vel[2]);
        line += buffer;
      }
      if (doForces_ && atomInfo->hasForce) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->frc[0],
                 atomInfo->frc[1], atomInfo->frc[2]);
        line += buffer;
      }
      if (doElectricFields_ && atomInfo->hasElectricField) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->eField[0],
                 atomInfo->eField[1], atomInfo->eField[2]);
        line += buffer;
      }
      if (doGlobalIDs_) {
        snprintf(buffer, 1024, "%10d", atomInfo->globalID);
        line += buffer;
      }

      frame.push_back(line);
    }
  }